

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_105c52d::BlendA64MaskTest8B_d16_ExtremeValues_Test::TestBody
          (BlendA64MaskTest8B_d16_ExtremeValues_Test *this)

{
  bool bVar1;
  BlendA64MaskTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int,_ConvolveParams_*),_unsigned_short,_unsigned_char>
  *in_RDI;
  int bsize;
  int i_1;
  int i;
  int in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffdc;
  int local_14;
  int local_10;
  int local_c;
  
  for (local_c = 0; local_c < 0x14000; local_c = local_c + 1) {
    in_RDI->dst_ref_[local_c] = 0xff;
    in_RDI->dst_tst_[local_c] = 0xff;
    in_RDI->src0_[local_c] = 0x3fff;
    in_RDI->src1_[local_c] = 0x3fff;
  }
  for (local_10 = 0; local_10 < 0x10000; local_10 = local_10 + 1) {
    in_RDI->mask_[local_10] = '?';
  }
  local_14 = 0;
  while( true ) {
    in_stack_ffffffffffffffdc = in_stack_ffffffffffffffdc & 0xffffff;
    if (local_14 < 0x16) {
      bVar1 = testing::Test::HasFatalFailure();
      in_stack_ffffffffffffffdc = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffdc) ^ 0xff000000;
    }
    if ((in_stack_ffffffffffffffdc & 0x1000000) == 0) break;
    BlendA64MaskTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int,_ConvolveParams_*),_unsigned_short,_unsigned_char>
    ::RunTest(in_RDI,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

TEST_P(BlendA64MaskTest8B_d16, ExtremeValues) {
  for (int i = 0; i < kBufSize; ++i) {
    dst_ref_[i] = 255;
    dst_tst_[i] = 255;

    src0_[i] = kSrcMaxBitsMask;
    src1_[i] = kSrcMaxBitsMask;
  }

  for (int i = 0; i < kMaxMaskSize; ++i) mask_[i] = AOM_BLEND_A64_MAX_ALPHA - 1;

  for (int bsize = 0; bsize < BLOCK_SIZES_ALL && !HasFatalFailure(); ++bsize)
    RunTest(bsize, 1);
}